

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_relation.cpp
# Opt level: O1

void __thiscall duckdb::ReadJSONRelation::~ReadJSONRelation(ReadJSONRelation *this)

{
  ~ReadJSONRelation(this);
  operator_delete(this);
  return;
}

Assistant:

ReadJSONRelation::~ReadJSONRelation() {
}